

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

void If_CluReverseOrder_old(word *pF,int nVars,int *V2P,int *P2V,int iVarStart)

{
  int p;
  int iVar1;
  word pG [1024];
  word local_2038 [1025];
  
  If_CluCopy(local_2038,pF,nVars);
  p = nVars + -1;
  for (iVar1 = iVarStart; iVar1 < nVars; iVar1 = iVar1 + 1) {
    If_CluMoveVar(pF,nVars,V2P,P2V,P2V[iVarStart],p);
    p = p + -1;
  }
  If_CluReverseOrder(local_2038,nVars,(int *)0x0,(int *)0x0,iVarStart);
  iVar1 = If_CluEqual(local_2038,pF,nVars);
  if (iVar1 != 0) {
    return;
  }
  printf("%d ",nVars);
  return;
}

Assistant:

void If_CluReverseOrder_old( word * pF, int nVars, int * V2P, int * P2V, int iVarStart )
{
    word pG[CLU_WRD_MAX];
    int v;

    If_CluCopy( pG, pF, nVars );

//    for ( v = 0; v < nVars; v++ )
//        printf( "%c ", 'a' + P2V[v] );
//    printf( "  ---  " );

    for ( v = iVarStart; v < nVars; v++ )
        If_CluMoveVar( pF, nVars, V2P, P2V, P2V[iVarStart], nVars - 1 - (v - iVarStart) );

//    for ( v = 0; v < nVars; v++ )
//        printf( "%c ", 'a' + P2V[v] );
//    printf( "\n" );

//    if ( iVarStart > 0 )
//        return;

    If_CluReverseOrder( pG, nVars, NULL, NULL, iVarStart );
    if ( If_CluEqual( pG, pF, nVars ) )
    {
//        printf( "+" );
    }
    else
    {
/*
        printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pG, nVars ); 
        printf( "\n" );
*/
        printf( "%d ", nVars );
    }
}